

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::CompoundStmt> __thiscall
mocker::Parser::compoundStmt(Parser *this,TokIter *iter,TokIter end)

{
  bool bVar1;
  TokenID TVar2;
  pointer pTVar3;
  SyntaxError *this_00;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<mocker::ast::CompoundStmt> sVar5;
  Position beg;
  Position end_00;
  __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
  local_120;
  pair<mocker::Position,_mocker::Position> local_118;
  size_t local_f8;
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  *pvStack_f0;
  Token *local_e8;
  size_t sStack_e0;
  pair<mocker::Position,_mocker::Position> local_d8;
  Token *local_b8;
  int local_b0;
  undefined1 local_98 [8];
  shared_ptr<mocker::ast::Statement> stmt;
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  stmts;
  GetTokenID local_60;
  GetTokenID id;
  size_t local_50;
  undefined1 auStack_38 [8];
  Position begPos;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  begPos.col = (size_t)end._M_current;
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
           ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                         *)end._M_current);
  Token::position((pair<mocker::Position,_mocker::Position> *)&id,pTVar3);
  auStack_38 = (undefined1  [8])id.end._M_current;
  begPos.line = local_50;
  GetTokenID::GetTokenID(&local_60,in_RCX);
  TVar2 = GetTokenID::operator()(&local_60,*(Token **)begPos.col);
  if (TVar2 == LeftBrace) {
    __gnu_cxx::
    __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
    ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  *)begPos.col);
    std::
    vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
    ::vector((vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
              *)&stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount);
    do {
      statement((Parser *)local_98,iter,(TokIter)begPos.col);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
      if (bVar1) {
        std::
        vector<std::shared_ptr<mocker::ast::Statement>,std::allocator<std::shared_ptr<mocker::ast::Statement>>>
        ::emplace_back<std::shared_ptr<mocker::ast::Statement>>
                  ((vector<std::shared_ptr<mocker::ast::Statement>,std::allocator<std::shared_ptr<mocker::ast::Statement>>>
                    *)&stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(shared_ptr<mocker::ast::Statement> *)local_98);
        local_b0 = 0;
      }
      else {
        local_b0 = 3;
      }
      std::shared_ptr<mocker::ast::Statement>::~shared_ptr
                ((shared_ptr<mocker::ast::Statement> *)local_98);
    } while (local_b0 == 0);
    local_b8 = *(Token **)begPos.col;
    TVar2 = GetTokenID::operator()(&local_60,(TokIter)local_b8);
    if (TVar2 != RightBrace) {
      this_00 = (SyntaxError *)__cxa_allocate_exception(0x48);
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                             *)begPos.col);
      Token::position(&local_d8,pTVar3);
      SyntaxError::SyntaxError(this_00,(Position *)auStack_38,&local_d8.second);
      __cxa_throw(this_00,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
    }
    local_e8 = (Token *)auStack_38;
    sStack_e0 = begPos.line;
    local_120 = __gnu_cxx::
                __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                              *)begPos.col,0);
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
             ::operator->(&local_120);
    Token::position(&local_118,pTVar3);
    local_f8 = local_118.second.line;
    pvStack_f0 = (vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
                  *)local_118.second.col;
    beg.col = (size_t)local_e8;
    beg.line = (size_t)iter;
    end_00.col = local_118.second.line;
    end_00.line = sStack_e0;
    makeNode<mocker::ast::CompoundStmt,std::vector<std::shared_ptr<mocker::ast::Statement>,std::allocator<std::shared_ptr<mocker::ast::Statement>>>>
              (this,beg,end_00,
               (vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
                *)local_118.second.col);
    local_b0 = 1;
    std::
    vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
    ::~vector((vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
               *)&stmt.super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<mocker::ast::CompoundStmt>::shared_ptr
              ((shared_ptr<mocker::ast::CompoundStmt> *)this,(nullptr_t)0x0);
    _Var4._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var4._M_pi;
  sVar5.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::CompoundStmt>)
         sVar5.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::CompoundStmt> Parser::compoundStmt(TokIter &iter,
                                                        TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  if (id(iter) != TokenID::LeftBrace)
    return nullptr;
  ++iter;
  std::vector<std::shared_ptr<ast::Statement>> stmts;
  while (auto stmt = statement(iter, end))
    stmts.emplace_back(std::move(stmt));
  if (id(iter) != TokenID::RightBrace)
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::CompoundStmt>(begPos, (iter++)->position().second,
                                     std::move(stmts));
}